

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

int main(int argc,char **argv)

{
  int at;
  char cVar1;
  ushort uVar2;
  uint uVar3;
  Territory TVar4;
  int iVar5;
  MapcodeError MVar6;
  int iVar7;
  MapcodeError MVar8;
  Territory TVar9;
  Alphabet AVar10;
  Territory TVar11;
  MapcodeError MVar12;
  int iVar13;
  int iVar14;
  unsigned_short *puVar15;
  size_t sVar16;
  TerritoryAlphabets *pTVar17;
  FILE *__stream;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  __int32_t **pp_Var21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined8 uVar26;
  int i_1;
  uint uVar27;
  ulong uVar28;
  Alphabet i;
  uint uVar29;
  int nrTests;
  long *plVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  char **ppcVar38;
  int i_3;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  uint uVar42;
  TerritoryBoundary *pTVar43;
  bool bVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint uStack_16038;
  uint uStack_16030;
  uint uStack_16028;
  uint uStack_1601c;
  char s1_2 [1];
  undefined7 uStack_16017;
  unsigned_short u1 [1];
  double lon2;
  int iStack_15ffc;
  int iStack_15ff8;
  int iStack_15ff4;
  ulong uStack_15ff0;
  ulong uStack_15fe8;
  long lStack_15fe0;
  double dStack_15fd8;
  double lat3;
  char largeString2 [10000];
  char s1 [1];
  char acStack_138b7 [19999];
  char s1_1 [1];
  char acStack_ea97 [7];
  undefined1 local_ea90;
  char acStack_ea8f [15];
  uint local_ea80;
  char local_ea7c [15971];
  undefined1 local_ac19;
  unsigned_short largeUnicodeString1 [10000];
  
  puts("Mapcode C Library Unit Tests");
  printf("Library version %s (data version %s)\n","2.5.5","2.3.0");
  printf("Using up to %d threads to test in parallel...\n",0x10);
  if ((argc != 1) || (argv == (char **)0x0)) {
    puts("*** ERROR *** unittest takes no arguments!");
    exit(1);
  }
  puts("-----------------------------------------------------------\nEnvironment tests");
  lVar41 = 0;
  printf("sizeof(char)=%ld, sizeof(UWORD)=%ld, sizeof(int)=%ld, sizeof(long int)=%ld char=%s\n",1,2,
         4,8,"signed");
  puts("-----------------------------------------------------------\nRobustness tests");
  testIncorrectGetTerritoryCode("UNKNOWN");
  testIncorrectGetTerritoryCode("A");
  testIncorrectGetTerritoryCode(" A");
  testIncorrectGetTerritoryCode("A ");
  testIncorrectGetTerritoryCode(" A ");
  testIncorrectGetTerritoryCode("AA");
  testIncorrectGetTerritoryCode(" AA");
  testIncorrectGetTerritoryCode("AA ");
  testIncorrectGetTerritoryCode(" AA ");
  testIncorrectGetTerritoryCode("US-");
  testIncorrectGetTerritoryCode(" US-");
  testIncorrectGetTerritoryCode("US- ");
  testIncorrectGetTerritoryCode(" US- ");
  testIncorrectGetTerritoryCode(" ");
  s1[0] = '\0';
  testIncorrectGetTerritoryCode(s1);
  uStack_16028 = 0xf;
  uStack_16038 = 0xe;
  uStack_16030 = 0xd;
  uVar31 = 0xc;
  uVar32 = 0xb;
  uVar33 = 10;
  uVar34 = 9;
  uVar35 = 8;
  uVar29 = 7;
  uVar42 = 6;
  uVar36 = 5;
  uVar39 = 4;
  uVar27 = 3;
  uVar3 = 2;
  uStack_1601c = 1;
  auVar90 = _DAT_001d3010;
  auVar48 = _DAT_001d3020;
  auVar51 = _DAT_001d3030;
  auVar54 = _DAT_001d3040;
  auVar57 = _DAT_001d3050;
  auVar60 = _DAT_001d3060;
  auVar63 = _DAT_001d3070;
  auVar66 = _DAT_001d3080;
  do {
    auVar71 = auVar66 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar82._4_4_ = iVar5;
    auVar82._0_4_ = iVar5;
    auVar82._8_4_ = iVar7;
    auVar82._12_4_ = iVar7;
    auVar105._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar105._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar105._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar105._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar72._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar72._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar72._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar72._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar72 = auVar72 & auVar105;
    auVar71 = pshuflw(auVar82,auVar72,0xe8);
    auVar71 = packssdw(auVar71,auVar71);
    cVar1 = (char)lVar41;
    if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar23 = ((uint)lVar41 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = (((uint)lVar41 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      s1_1[lVar41] = (char)(uVar23 << 5) + (char)uVar23 + ' ' + cVar1;
    }
    auVar71 = packssdw(auVar72,auVar72);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._0_4_ >> 8 & 1) != 0) {
      uVar23 = (uStack_1601c & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_1601c - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41] = (char)(uVar23 << 5) + (char)uVar23 + '!' + cVar1;
    }
    auVar71 = auVar63 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar83._4_4_ = iVar5;
    auVar83._0_4_ = iVar5;
    auVar83._8_4_ = iVar7;
    auVar83._12_4_ = iVar7;
    auVar106._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar106._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar106._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar106._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar73._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar73._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar73._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar73._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar73 = auVar73 & auVar106;
    auVar71 = packssdw(auVar83,auVar73);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._0_4_ >> 0x10 & 1) != 0) {
      uVar23 = (uVar3 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar3 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 1] = (char)(uVar23 << 5) + (char)uVar23 + '\"' + cVar1;
    }
    auVar71 = pshufhw(auVar73,auVar73,0x84);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._0_4_ >> 0x18 & 1) != 0) {
      uVar23 = (uVar27 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar27 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 2] = (char)(uVar23 << 5) + (char)uVar23 + '#' + cVar1;
    }
    auVar71 = auVar60 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar84._4_4_ = iVar5;
    auVar84._0_4_ = iVar5;
    auVar84._8_4_ = iVar7;
    auVar84._12_4_ = iVar7;
    auVar107._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar107._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar107._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar107._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar74._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar74._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar74._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar74._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar74 = auVar74 & auVar107;
    auVar71 = pshuflw(auVar84,auVar74,0xe8);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar39 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar39 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 3] = (char)(uVar23 << 5) + (char)uVar23 + '$' + cVar1;
    }
    auVar71 = packssdw(auVar74,auVar74);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._4_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar36 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar36 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 4] = (char)(uVar23 << 5) + (char)uVar23 + '%' + cVar1;
    }
    auVar71 = auVar57 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar85._4_4_ = iVar5;
    auVar85._0_4_ = iVar5;
    auVar85._8_4_ = iVar7;
    auVar85._12_4_ = iVar7;
    auVar108._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar108._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar108._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar108._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar75._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar75._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar75._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar75._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar75 = auVar75 & auVar108;
    auVar71 = packssdw(auVar85,auVar75);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar42 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar42 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 5] = (char)(uVar23 << 5) + (char)uVar23 + '&' + cVar1;
    }
    auVar71 = pshufhw(auVar75,auVar75,0x84);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._6_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar29 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar29 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea97[lVar41 + 6] = (char)(uVar23 << 5) + (char)uVar23 + '\'' + cVar1;
    }
    auVar71 = auVar54 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar86._4_4_ = iVar5;
    auVar86._0_4_ = iVar5;
    auVar86._8_4_ = iVar7;
    auVar86._12_4_ = iVar7;
    auVar109._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar109._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar109._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar109._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar76._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar76._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar76._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar76._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar76 = auVar76 & auVar109;
    auVar71 = pshuflw(auVar86,auVar76,0xe8);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar23 = (uVar35 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar35 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + -1] = (char)(uVar23 << 5) + (char)uVar23 + '(' + cVar1;
    }
    auVar71 = packssdw(auVar76,auVar76);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._8_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar34 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar34 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41] = (char)(uVar23 << 5) + (char)uVar23 + ')' + cVar1;
    }
    auVar71 = auVar51 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar87._4_4_ = iVar5;
    auVar87._0_4_ = iVar5;
    auVar87._8_4_ = iVar7;
    auVar87._12_4_ = iVar7;
    auVar110._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar110._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar110._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar110._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar77._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar77._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar77._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar77._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar77 = auVar77 & auVar110;
    auVar71 = packssdw(auVar87,auVar77);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      uVar23 = (uVar33 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar33 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 1] = (char)(uVar23 << 5) + (char)uVar23 + '*' + cVar1;
    }
    auVar71 = pshufhw(auVar77,auVar77,0x84);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._10_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar32 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar32 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 2] = (char)(uVar23 << 5) + (char)uVar23 + '+' + cVar1;
    }
    auVar71 = auVar48 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar88._4_4_ = iVar5;
    auVar88._0_4_ = iVar5;
    auVar88._8_4_ = iVar7;
    auVar88._12_4_ = iVar7;
    auVar111._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar111._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar111._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar111._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar78._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar78._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar78._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar78._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar78 = auVar78 & auVar111;
    auVar71 = pshuflw(auVar88,auVar78,0xe8);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar31 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar31 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 3] = (char)(uVar23 << 5) + (char)uVar23 + ',' + cVar1;
    }
    auVar71 = packssdw(auVar78,auVar78);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._12_2_ >> 8 & 1) != 0) {
      uVar23 = (uStack_16030 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16030 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 4] = (char)(uVar23 << 5) + (char)uVar23 + '-' + cVar1;
    }
    auVar71 = auVar90 ^ _DAT_001d30a0;
    iVar5 = auVar71._0_4_;
    iVar7 = auVar71._8_4_;
    auVar89._4_4_ = iVar5;
    auVar89._0_4_ = iVar5;
    auVar89._8_4_ = iVar7;
    auVar89._12_4_ = iVar7;
    auVar112._0_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar112._4_4_ = -(uint)(iVar5 < -0x7fffc181);
    auVar112._8_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar112._12_4_ = -(uint)(iVar7 < -0x7fffc181);
    auVar79._0_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar79._4_4_ = -(uint)(auVar71._4_4_ == -0x80000000);
    auVar79._8_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar79._12_4_ = -(uint)(auVar71._12_4_ == -0x80000000);
    auVar79 = auVar79 & auVar112;
    auVar71 = packssdw(auVar89,auVar79);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar23 = (uStack_16038 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16038 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 5] = (char)(uVar23 << 5) + (char)uVar23 + '.' + cVar1;
    }
    auVar71 = pshufhw(auVar79,auVar79,0x84);
    auVar71 = packssdw(auVar71,auVar71);
    auVar71 = packsswb(auVar71,auVar71);
    if ((auVar71._14_2_ >> 8 & 1) != 0) {
      uVar23 = (uStack_16028 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16028 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_ea8f[lVar41 + 6] = (char)(uVar23 << 5) + (char)uVar23 + '/' + cVar1;
    }
    lVar41 = lVar41 + 0x10;
    lVar22 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar22 + 0x10;
    lVar22 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 0x10;
    auVar63._8_8_ = lVar22 + 0x10;
    lVar22 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 0x10;
    auVar60._8_8_ = lVar22 + 0x10;
    lVar22 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + 0x10;
    auVar57._8_8_ = lVar22 + 0x10;
    lVar22 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + 0x10;
    auVar54._8_8_ = lVar22 + 0x10;
    lVar22 = auVar51._8_8_;
    auVar51._0_8_ = auVar51._0_8_ + 0x10;
    auVar51._8_8_ = lVar22 + 0x10;
    lVar22 = auVar48._8_8_;
    auVar48._0_8_ = auVar48._0_8_ + 0x10;
    auVar48._8_8_ = lVar22 + 0x10;
    lVar22 = auVar90._8_8_;
    auVar90._0_8_ = auVar90._0_8_ + 0x10;
    auVar90._8_8_ = lVar22 + 0x10;
    uStack_16028 = uStack_16028 + 0x10;
    uStack_16038 = uStack_16038 + 0x10;
    uStack_16030 = uStack_16030 + 0x10;
    uVar31 = uVar31 + 0x10;
    uVar32 = uVar32 + 0x10;
    uVar33 = uVar33 + 0x10;
    uVar34 = uVar34 + 0x10;
    uVar35 = uVar35 + 0x10;
    uVar29 = uVar29 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar27 = uVar27 + 0x10;
    uVar3 = uVar3 + 0x10;
    uStack_1601c = uStack_1601c + 0x10;
  } while (lVar41 != 16000);
  lVar41 = 0;
  local_ac19 = 0;
  testIncorrectGetTerritoryCode(s1_1);
  testCorrectEncode(-90.0,0.0,1);
  testCorrectEncode(90.0,0.0,1);
  testCorrectEncode(-91.0,0.0,1);
  testCorrectEncode(91.0,0.0,1);
  testCorrectEncode(0.0,-180.0,1);
  testCorrectEncode(0.0,180.0,1);
  testCorrectEncode(1.0,-181.0,1);
  iVar5 = 1;
  testCorrectEncode(0.0,181.0,1);
  testIncorrectEncode(0.0,NAN,iVar5);
  testIncorrectEncode(NAN,0.0,iVar5);
  testIncorrectEncode(NAN,NAN,iVar5);
  iVar5 = 0;
  testCorrectEncode(INFINITY,0.0,0);
  testIncorrectEncode(0.0,INFINITY,iVar5);
  testIncorrectEncode(INFINITY,INFINITY,iVar5);
  iVar5 = 0;
  testCorrectEncode(-INFINITY,0.0,0);
  testIncorrectEncode(0.0,-INFINITY,iVar5);
  testIncorrectEncode(-INFINITY,-INFINITY,iVar5);
  testCorrectEncode(1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,1.79769313486232e+308,0);
  testCorrectEncode(1.79769313486232e+308,1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,-1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,-1.79769313486232e+308,0);
  TVar4 = getTerritoryCode("NLD",TERRITORY_NONE);
  testIncorrectDecode("",TERRITORY_NONE);
  testIncorrectDecode(" ",TERRITORY_NONE);
  testIncorrectDecode("AA",TERRITORY_NONE);
  testIncorrectDecode("",TVar4);
  testIncorrectDecode(" ",TVar4);
  testIncorrectDecode("AA",TVar4);
  testIncorrectDecode("XX.XX",TERRITORY_NONE);
  testCorrectDecode("NLD XX.XX",TVar4);
  testCorrectDecode("NLD 39.UC",TVar4);
  testCorrectDecode("W9.SX9",TVar4);
  testCorrectDecode("MEX 49.4V",TVar4);
  testCorrectDecode("NLD XX.XX",TERRITORY_NONE);
  testCorrectDecode("MX XX.XX",TERRITORY_NONE);
  s1_1[0] = '\0';
  testIncorrectDecode(s1_1,TERRITORY_NONE);
  testIncorrectDecode(s1_1,TVar4);
  testIncorrectDecode(s1_1,TERRITORY_NONE);
  testIncorrectDecode(s1_1,TVar4);
  puts("-----------------------------------------------------------\nAlphabet tests");
  s1_2[0] = '\0';
  uStack_16028 = 0xf;
  uStack_16038 = 0xe;
  uStack_16030 = 0xd;
  uVar29 = 0xc;
  uVar31 = 0xb;
  uVar32 = 10;
  uVar33 = 9;
  uVar34 = 8;
  uVar27 = 7;
  uVar39 = 6;
  uVar42 = 0x220005;
  uVar35 = 0x220004;
  uVar36 = 0x220003;
  uVar3 = 2;
  uStack_1601c = 1;
  auVar71 = _DAT_001d3010;
  auVar49 = _DAT_001d3020;
  auVar52 = _DAT_001d3030;
  auVar55 = _DAT_001d3040;
  auVar58 = _DAT_001d3050;
  auVar61 = _DAT_001d3060;
  auVar64 = _DAT_001d3070;
  auVar67 = _DAT_001d3080;
  do {
    auVar90 = auVar67 ^ _DAT_001d30a0;
    auVar113._0_4_ = -(uint)(auVar90._0_4_ < -0x7fffb1e1);
    auVar113._4_4_ = -(uint)(auVar90._0_4_ < -0x7fffb1e1);
    auVar113._8_4_ = -(uint)(auVar90._8_4_ < -0x7fffb1e1);
    auVar113._12_4_ = -(uint)(auVar90._8_4_ < -0x7fffb1e1);
    auVar91._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar91._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar91._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar91._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar91 = auVar91 & auVar113;
    auVar90 = pshuflw(auVar113,auVar91,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    cVar1 = (char)lVar41;
    if ((auVar90 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar23 = ((uint)lVar41 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = (((uint)lVar41 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      s1[lVar41] = (char)(uVar23 << 5) + (char)uVar23 + ' ' + cVar1;
    }
    auVar90 = packssdw(auVar91,auVar91);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 8 & 1) != 0) {
      uVar23 = (uStack_1601c & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_1601c - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41] = (char)(uVar23 << 5) + (char)uVar23 + '!' + cVar1;
    }
    auVar90 = auVar64 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar114._4_4_ = iVar5;
    auVar114._0_4_ = iVar5;
    auVar114._8_4_ = iVar7;
    auVar114._12_4_ = iVar7;
    auVar127._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar127._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar127._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar127._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar92._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar92._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar92._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar92._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar92 = auVar92 & auVar127;
    auVar90 = packssdw(auVar114,auVar92);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 0x10 & 1) != 0) {
      uVar23 = (uVar3 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar3 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 1] = (char)(uVar23 << 5) + (char)uVar23 + '\"' + cVar1;
    }
    auVar90 = pshufhw(auVar92,auVar92,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 0x18 & 1) != 0) {
      uVar23 = (uVar36 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar36 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 2] = (char)(uVar23 << 5) + (char)uVar23 + '#' + cVar1;
    }
    auVar90 = auVar61 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar115._4_4_ = iVar5;
    auVar115._0_4_ = iVar5;
    auVar115._8_4_ = iVar7;
    auVar115._12_4_ = iVar7;
    auVar128._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar128._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar128._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar128._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar93._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar93._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar93._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar93._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar93 = auVar93 & auVar128;
    auVar90 = pshuflw(auVar115,auVar93,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar35 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar35 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 3] = (char)(uVar23 << 5) + (char)uVar23 + '$' + cVar1;
    }
    auVar90 = packssdw(auVar93,auVar93);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._4_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar42 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar42 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 4] = (char)(uVar23 << 5) + (char)uVar23 + '%' + cVar1;
    }
    auVar90 = auVar58 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar116._4_4_ = iVar5;
    auVar116._0_4_ = iVar5;
    auVar116._8_4_ = iVar7;
    auVar116._12_4_ = iVar7;
    auVar129._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar129._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar129._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar129._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar94._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar94._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar94._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar94._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar94 = auVar94 & auVar129;
    auVar90 = packssdw(auVar116,auVar94);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar39 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar39 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 5] = (char)(uVar23 << 5) + (char)uVar23 + '&' + cVar1;
    }
    auVar90 = pshufhw(auVar94,auVar94,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._6_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar27 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar27 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 6] = (char)(uVar23 << 5) + (char)uVar23 + '\'' + cVar1;
    }
    auVar90 = auVar55 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar117._4_4_ = iVar5;
    auVar117._0_4_ = iVar5;
    auVar117._8_4_ = iVar7;
    auVar117._12_4_ = iVar7;
    auVar130._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar130._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar130._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar130._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar95._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar95._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar95._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar95._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar95 = auVar95 & auVar130;
    auVar90 = pshuflw(auVar117,auVar95,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar23 = (uVar34 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar34 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 7] = (char)(uVar23 << 5) + (char)uVar23 + '(' + cVar1;
    }
    auVar90 = packssdw(auVar95,auVar95);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._8_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar33 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar33 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 8] = (char)(uVar23 << 5) + (char)uVar23 + ')' + cVar1;
    }
    auVar90 = auVar52 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar118._4_4_ = iVar5;
    auVar118._0_4_ = iVar5;
    auVar118._8_4_ = iVar7;
    auVar118._12_4_ = iVar7;
    auVar131._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar131._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar131._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar131._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar96._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar96._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar96._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar96._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar96 = auVar96 & auVar131;
    auVar90 = packssdw(auVar118,auVar96);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      uVar23 = (uVar32 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar32 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 9] = (char)(uVar23 << 5) + (char)uVar23 + '*' + cVar1;
    }
    auVar90 = pshufhw(auVar96,auVar96,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._10_2_ >> 8 & 1) != 0) {
      uVar23 = (uVar31 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar31 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 10] = (char)(uVar23 << 5) + (char)uVar23 + '+' + cVar1;
    }
    auVar90 = auVar49 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar119._4_4_ = iVar5;
    auVar119._0_4_ = iVar5;
    auVar119._8_4_ = iVar7;
    auVar119._12_4_ = iVar7;
    auVar132._0_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar132._4_4_ = -(uint)(iVar5 < -0x7fffb1e1);
    auVar132._8_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar132._12_4_ = -(uint)(iVar7 < -0x7fffb1e1);
    auVar97._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar97._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar97._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar97._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar97 = auVar97 & auVar132;
    auVar90 = pshuflw(auVar119,auVar97,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar23 = (uVar29 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uVar29 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 0xb] = (char)(uVar23 << 5) + (char)uVar23 + ',' + cVar1;
    }
    auVar90 = packssdw(auVar97,auVar97);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._12_2_ >> 8 & 1) != 0) {
      uVar23 = (uStack_16030 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16030 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 0xc] = (char)(uVar23 << 5) + (char)uVar23 + '-' + cVar1;
    }
    auVar90 = auVar71 ^ _DAT_001d30a0;
    auVar80._0_4_ = -(uint)(auVar90._0_4_ < -0x7fffb1e1);
    auVar80._4_4_ = -(uint)(auVar90._0_4_ < -0x7fffb1e1);
    auVar80._8_4_ = -(uint)(auVar90._8_4_ < -0x7fffb1e1);
    auVar80._12_4_ = -(uint)(auVar90._8_4_ < -0x7fffb1e1);
    auVar69._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar69._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar69._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar69._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar69 = auVar69 & auVar80;
    auVar90 = packssdw(auVar80,auVar69);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar23 = (uStack_16038 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16038 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 0xd] = (char)(uVar23 << 5) + (char)uVar23 + '.' + cVar1;
    }
    auVar90 = pshufhw(auVar69,auVar69,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._14_2_ >> 8 & 1) != 0) {
      uVar23 = (uStack_16028 & 0xffff) * 0x25e3 >> 0x10;
      uVar23 = ((uStack_16028 - uVar23 & 0xffff) >> 1) + uVar23 >> 7;
      acStack_138b7[lVar41 + 0xe] = (char)(uVar23 << 5) + (char)uVar23 + '/' + cVar1;
    }
    lVar41 = lVar41 + 0x10;
    lVar22 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 0x10;
    auVar67._8_8_ = lVar22 + 0x10;
    lVar22 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 0x10;
    auVar64._8_8_ = lVar22 + 0x10;
    lVar22 = auVar61._8_8_;
    auVar61._0_8_ = auVar61._0_8_ + 0x10;
    auVar61._8_8_ = lVar22 + 0x10;
    lVar22 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + 0x10;
    auVar58._8_8_ = lVar22 + 0x10;
    lVar22 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + 0x10;
    auVar55._8_8_ = lVar22 + 0x10;
    lVar22 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + 0x10;
    auVar52._8_8_ = lVar22 + 0x10;
    lVar22 = auVar49._8_8_;
    auVar49._0_8_ = auVar49._0_8_ + 0x10;
    auVar49._8_8_ = lVar22 + 0x10;
    lVar22 = auVar71._8_8_;
    auVar71._0_8_ = auVar71._0_8_ + 0x10;
    auVar71._8_8_ = lVar22 + 0x10;
    uStack_16028 = uStack_16028 + 0x10;
    uStack_16038 = uStack_16038 + 0x10;
    uStack_16030 = uStack_16030 + 0x10;
    uVar29 = uVar29 + 0x10;
    uVar31 = uVar31 + 0x10;
    uVar32 = uVar32 + 0x10;
    uVar33 = uVar33 + 0x10;
    uVar34 = uVar34 + 0x10;
    uVar27 = uVar27 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar35 = uVar35 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar3 = uVar3 + 0x10;
    uStack_1601c = uStack_1601c + 0x10;
  } while (lVar41 != 20000);
  acStack_138b7[0x4e1e] = 0;
  uStack_16028 = 0xf;
  uStack_16038 = 0xe;
  uVar3 = 0xd;
  uVar31 = 0xc;
  uVar32 = 0xb;
  uVar33 = 10;
  uVar34 = 9;
  uVar35 = 8;
  uVar27 = 7;
  uVar29 = 6;
  uVar42 = 5;
  uVar23 = 4;
  uVar36 = 3;
  uVar39 = 2;
  uStack_1601c = 1;
  lVar41 = 0;
  auVar47 = _DAT_001d3010;
  auVar50 = _DAT_001d3020;
  auVar53 = _DAT_001d3030;
  auVar56 = _DAT_001d3040;
  auVar59 = _DAT_001d3050;
  auVar62 = _DAT_001d3060;
  auVar65 = _DAT_001d3070;
  auVar68 = _DAT_001d3080;
  do {
    auVar90 = auVar68 ^ _DAT_001d30a0;
    auVar120._0_4_ = -(uint)(auVar90._0_4_ < -0x7fffd8f1);
    auVar120._4_4_ = -(uint)(auVar90._0_4_ < -0x7fffd8f1);
    auVar120._8_4_ = -(uint)(auVar90._8_4_ < -0x7fffd8f1);
    auVar120._12_4_ = -(uint)(auVar90._8_4_ < -0x7fffd8f1);
    auVar98._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar98._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar98._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar98._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar98 = auVar98 & auVar120;
    auVar90 = pshuflw(auVar120,auVar98,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    uVar25 = (uint)lVar41;
    cVar1 = (char)lVar41;
    if ((auVar90 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar24 = (uVar25 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar25 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41] = (char)(uVar24 << 5) + (char)uVar24 + ' ' + cVar1;
    }
    auVar90 = packssdw(auVar98,auVar98);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 8 & 1) != 0) {
      uVar24 = (uStack_1601c & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uStack_1601c - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 1] = (char)(uVar24 << 5) + (char)uVar24 + '!' + cVar1;
    }
    auVar90 = auVar65 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar121._4_4_ = iVar5;
    auVar121._0_4_ = iVar5;
    auVar121._8_4_ = iVar7;
    auVar121._12_4_ = iVar7;
    auVar133._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar133._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar133._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar133._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar99._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar99._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar99._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar99._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar99 = auVar99 & auVar133;
    auVar90 = packssdw(auVar121,auVar99);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 0x10 & 1) != 0) {
      uVar24 = (uVar39 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar39 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 2] = (char)(uVar24 << 5) + (char)uVar24 + '\"' + cVar1;
    }
    auVar90 = pshufhw(auVar99,auVar99,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._0_4_ >> 0x18 & 1) != 0) {
      uVar24 = (uVar36 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar36 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 3] = (char)(uVar24 << 5) + (char)uVar24 + '#' + cVar1;
    }
    auVar90 = auVar62 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar122._4_4_ = iVar5;
    auVar122._0_4_ = iVar5;
    auVar122._8_4_ = iVar7;
    auVar122._12_4_ = iVar7;
    auVar134._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar134._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar134._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar134._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar100._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar100._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar100._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar100._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar100 = auVar100 & auVar134;
    auVar90 = pshuflw(auVar122,auVar100,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar24 = (uVar23 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar23 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 4] = (char)(uVar24 << 5) + (char)uVar24 + '$' + cVar1;
    }
    auVar90 = packssdw(auVar100,auVar100);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._4_2_ >> 8 & 1) != 0) {
      uVar24 = (uVar42 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar42 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 5] = (char)(uVar24 << 5) + (char)uVar24 + '%' + cVar1;
    }
    auVar90 = auVar59 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar123._4_4_ = iVar5;
    auVar123._0_4_ = iVar5;
    auVar123._8_4_ = iVar7;
    auVar123._12_4_ = iVar7;
    auVar135._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar135._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar135._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar135._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar101._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar101._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar101._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar101._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar101 = auVar101 & auVar135;
    auVar90 = packssdw(auVar123,auVar101);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar24 = (uVar29 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar29 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 6] = (char)(uVar24 << 5) + (char)uVar24 + '&' + cVar1;
    }
    auVar90 = pshufhw(auVar101,auVar101,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._6_2_ >> 8 & 1) != 0) {
      uVar24 = (uVar27 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar27 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 7] = (char)(uVar24 << 5) + (char)uVar24 + '\'' + cVar1;
    }
    auVar90 = auVar56 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar124._4_4_ = iVar5;
    auVar124._0_4_ = iVar5;
    auVar124._8_4_ = iVar7;
    auVar124._12_4_ = iVar7;
    auVar136._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar136._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar136._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar136._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar102._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar102._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar102._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar102._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar102 = auVar102 & auVar136;
    auVar90 = pshuflw(auVar124,auVar102,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar24 = (uVar35 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar35 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 8] = (char)(uVar24 << 5) + (char)uVar24 + '(' + cVar1;
    }
    auVar90 = packssdw(auVar102,auVar102);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._8_2_ >> 8 & 1) != 0) {
      uVar24 = (uVar34 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar34 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 9] = (char)(uVar24 << 5) + (char)uVar24 + ')' + cVar1;
    }
    auVar90 = auVar53 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar125._4_4_ = iVar5;
    auVar125._0_4_ = iVar5;
    auVar125._8_4_ = iVar7;
    auVar125._12_4_ = iVar7;
    auVar137._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar137._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar137._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar137._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar103._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar103._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar103._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar103._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar103 = auVar103 & auVar137;
    auVar90 = packssdw(auVar125,auVar103);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      uVar24 = (uVar33 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar33 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 10] = (char)(uVar24 << 5) + (char)uVar24 + '*' + cVar1;
    }
    auVar90 = pshufhw(auVar103,auVar103,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._10_2_ >> 8 & 1) != 0) {
      uVar24 = (uVar32 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar32 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 0xb] = (char)(uVar24 << 5) + (char)uVar24 + '+' + cVar1;
    }
    auVar90 = auVar50 ^ _DAT_001d30a0;
    iVar5 = auVar90._0_4_;
    iVar7 = auVar90._8_4_;
    auVar126._4_4_ = iVar5;
    auVar126._0_4_ = iVar5;
    auVar126._8_4_ = iVar7;
    auVar126._12_4_ = iVar7;
    auVar138._0_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar138._4_4_ = -(uint)(iVar5 < -0x7fffd8f1);
    auVar138._8_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar138._12_4_ = -(uint)(iVar7 < -0x7fffd8f1);
    auVar104._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar104._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar104._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar104._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar104 = auVar104 & auVar138;
    auVar90 = pshuflw(auVar126,auVar104,0xe8);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      uVar24 = (uVar31 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar31 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 0xc] = (char)(uVar24 << 5) + (char)uVar24 + ',' + cVar1;
    }
    auVar90 = packssdw(auVar104,auVar104);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90._12_2_ >> 8 & 1) != 0) {
      uVar24 = (uVar3 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uVar3 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 0xd] = (char)(uVar24 << 5) + (char)uVar24 + '-' + cVar1;
    }
    auVar90 = auVar47 ^ _DAT_001d30a0;
    auVar81._0_4_ = -(uint)(auVar90._0_4_ < -0x7fffd8f1);
    auVar81._4_4_ = -(uint)(auVar90._0_4_ < -0x7fffd8f1);
    auVar81._8_4_ = -(uint)(auVar90._8_4_ < -0x7fffd8f1);
    auVar81._12_4_ = -(uint)(auVar90._8_4_ < -0x7fffd8f1);
    auVar70._0_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar70._4_4_ = -(uint)(auVar90._4_4_ == -0x80000000);
    auVar70._8_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar70._12_4_ = -(uint)(auVar90._12_4_ == -0x80000000);
    auVar70 = auVar70 & auVar81;
    auVar90 = packssdw(auVar81,auVar70);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    if ((auVar90 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      uVar24 = (uStack_16038 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uStack_16038 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      largeString2[lVar41 + 0xe] = (char)(uVar24 << 5) + (char)uVar24 + '.' + cVar1;
    }
    auVar90 = pshufhw(auVar70,auVar70,0x84);
    auVar90 = packssdw(auVar90,auVar90);
    auVar90 = packsswb(auVar90,auVar90);
    uVar2 = auVar90._14_2_ >> 8;
    uVar40 = (ulong)uVar2;
    if ((uVar2 & 1) != 0) {
      uVar24 = (uStack_16028 & 0xffff) * 0x25e3 >> 0x10;
      uVar24 = ((uStack_16028 - uVar24 & 0xffff) >> 1) + uVar24 >> 7;
      uVar25 = (byte)((char)(uVar24 << 5) + (char)uVar24 + 0x2f) + uVar25;
      uVar40 = (ulong)uVar25;
      largeString2[lVar41 + 0xf] = (char)uVar25;
    }
    lVar41 = lVar41 + 0x10;
    lVar22 = auVar68._8_8_;
    auVar68._0_8_ = auVar68._0_8_ + 0x10;
    auVar68._8_8_ = lVar22 + 0x10;
    lVar22 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 0x10;
    auVar65._8_8_ = lVar22 + 0x10;
    lVar22 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 0x10;
    auVar62._8_8_ = lVar22 + 0x10;
    lVar22 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 0x10;
    auVar59._8_8_ = lVar22 + 0x10;
    lVar22 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + 0x10;
    auVar56._8_8_ = lVar22 + 0x10;
    lVar22 = auVar53._8_8_;
    auVar53._0_8_ = auVar53._0_8_ + 0x10;
    auVar53._8_8_ = lVar22 + 0x10;
    lVar22 = auVar50._8_8_;
    auVar50._0_8_ = auVar50._0_8_ + 0x10;
    auVar50._8_8_ = lVar22 + 0x10;
    lVar22 = auVar47._8_8_;
    auVar47._0_8_ = auVar47._0_8_ + 0x10;
    auVar47._8_8_ = lVar22 + 0x10;
    uStack_16028 = uStack_16028 + 0x10;
    uStack_16038 = uStack_16038 + 0x10;
    uVar3 = uVar3 + 0x10;
    uVar31 = uVar31 + 0x10;
    uVar32 = uVar32 + 0x10;
    uVar33 = uVar33 + 0x10;
    uVar34 = uVar34 + 0x10;
    uVar35 = uVar35 + 0x10;
    uVar27 = uVar27 + 0x10;
    uVar29 = uVar29 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar23 = uVar23 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar39 = uVar39 + 0x10;
    uStack_1601c = uStack_1601c + 0x10;
  } while (lVar41 != 10000);
  largeString2[9999] = '\0';
  pcVar18 = (char *)0x0;
  do {
    puVar15 = convertMapcodeToAlphabetUtf16(u1,"",(Alphabet)pcVar18);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar15 != (unsigned_short *)0x0),pcVar18,(int)uVar40);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 must return empty string",(uint)(*puVar15 == 0),
               pcVar18,(int)uVar40);
    myConvertToRoman(s1_2,u1);
    testAlphabetAssertion
              ("myConvertToRoman must return empty string",(uint)(s1_2[0] == '\0'),pcVar18,
               (int)uVar40);
    puVar15 = convertMapcodeToAlphabetUtf16(largeUnicodeString1,s1,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar15 != (unsigned_short *)0x0),pcVar18,(int)uVar40);
    myConvertToRoman(s1,puVar15);
    sVar16 = strlen(s1);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar16 < 20000),pcVar18,(int)uVar40);
    puVar15 = convertMapcodeToAlphabetUtf16((unsigned_short *)s1_1,largeString2,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar15 != (unsigned_short *)0x0),pcVar18,(int)uVar40);
    myConvertToRoman(largeString2,puVar15);
    sVar16 = strlen(largeString2);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar16 < 10000),pcVar18,(int)uVar40);
    uVar3 = (Alphabet)pcVar18 + ALPHABET_GREEK;
    pcVar18 = (char *)(ulong)uVar3;
  } while (uVar3 != 0x1c);
  printf("%d alphabets\n",0x1c);
  uVar40 = 0;
  do {
    pcVar18 = (&testAlphabets_TEST_PAIRS)[uVar40];
    pcVar19 = (&PTR_anon_var_dwarf_2c43_002da308)[uVar40];
    uVar28 = 0;
    do {
      AVar10 = (Alphabet)uVar28;
      convertMapcodeToAlphabetUtf16((unsigned_short *)s1,pcVar18,AVar10);
      convertMapcodeToAlphabetUtf8(s1_1,pcVar18,AVar10);
      decodeMapcodeToLatLonUtf16
                ((double *)largeString2,(double *)u1,(unsigned_short *)s1,TERRITORY_FRA,
                 (MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                ((double *)s1_2,&lon2,s1_1,TERRITORY_FRA,(MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                (&lat3,&dStack_15fd8,pcVar18,TERRITORY_FRA,(MapcodeElements *)largeUnicodeString1);
      if ((((((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_2[0])) ||
            (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_2[0])))) ||
           (_u1 != lon2)) || ((NAN(_u1) || NAN(lon2) || ((double)largeString2._0_8_ != lat3)))) ||
         (NAN((double)largeString2._0_8_) || NAN(lat3))) {
LAB_001cbc93:
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** Difference in ascii/utf8/utf16 decoding %s\n",pcVar18);
      }
      else if ((_u1 != dStack_15fd8) || (NAN(_u1) || NAN(dStack_15fd8))) goto LAB_001cbc93;
      myConvertToRoman(s1_1,(unsigned_short *)s1);
      iVar5 = strcmp(s1_1,pcVar19);
      if (iVar5 != 0) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myConvertToRoman(convertMapcodeToAlphabetUtf16(\"%s\",%d))=\"%s\"\n",
               pcVar18,uVar28,s1_1);
      }
      uVar28 = (ulong)(uint)(AVar10 + ALPHABET_GREEK);
    } while (AVar10 + ALPHABET_GREEK != 0x1c);
    bVar44 = uVar40 < 0xa2;
    uVar40 = uVar40 + 2;
  } while (bVar44);
  puts("-----------------------------------------------------------\nAlphabet per territory tests");
  TVar4 = TERRITORY_VAT;
  iVar5 = 0;
  do {
    pTVar17 = getAlphabetsForTerritory(TVar4);
    iVar7 = pTVar17->count;
    if (iVar7 - 4U < 0xfffffffd) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** Bad getAlphabetsForTerritory(%d) count: %d\n",(ulong)(uint)TVar4,
             (ulong)(uint)pTVar17->count);
      iVar7 = pTVar17->count;
      iStack_15ff8 = iVar5 + 1;
      if (0 < iVar7) goto LAB_001cbdd8;
    }
    else {
LAB_001cbdd8:
      uVar40 = 0;
      do {
        if (0x1b < (uint)pTVar17->alphabet[uVar40]) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** Bad ALPHABETS_FOR_TERRITORY[%d].alphabet[%d]: %d\n",
                 (ulong)(uint)TVar4,uVar40 & 0xffffffff,(ulong)(uint)pTVar17->alphabet[uVar40]);
          iVar7 = pTVar17->count;
        }
        uVar40 = uVar40 + 1;
      } while ((long)uVar40 < (long)iVar7);
      iStack_15ff8 = iVar5 + 1 + (int)uVar40;
    }
    TVar4 = TVar4 + 1;
    iVar5 = iStack_15ff8;
  } while (TVar4 != _TERRITORY_MAX);
  puts("-----------------------------------------------------------\nParser tests");
  lVar41 = 0;
  do {
    pcVar18 = *(char **)((long)&testAlphabetParser_convertTests + lVar41);
    AVar10 = *(Alphabet *)((long)&DAT_002da8b8 + lVar41);
    convertMapcodeToAlphabetUtf8(s1_1,pcVar18,AVar10);
    pcVar19 = *(char **)((long)&PTR_anon_var_dwarf_3479_002da8c0 + lVar41);
    iVar5 = strcmp(s1_1,pcVar19);
    if (iVar5 != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** convertMapcodeToAlphabetUtf8(\"%s\",%d) returned \"%s\", (expected %s)\n"
             ,pcVar18,(ulong)(uint)AVar10,s1_1,pcVar19);
    }
    lVar41 = lVar41 + 0x18;
  } while (lVar41 != 0x78);
  uVar40 = 5;
  lVar41 = 8;
  do {
    pcVar18 = *(char **)((long)&PTR_anon_var_dwarf_32af_002da818 + lVar41);
    MVar6 = decodeMapcodeToLatLonUtf8
                      ((double *)s1,(double *)largeUnicodeString1,pcVar18,TERRITORY_UNKNOWN,
                       (MapcodeElements *)s1_1);
    iVar5 = (int)uVar40;
    if (((uint)(MVar6 + ~ERR_BAD_MAPCODE_LENGTH) < 3) || (MVar6 == ERR_OK)) {
      pcVar19 = "NLD 49.YV\t";
      if (local_ea7c[0] != '\0') {
        pcVar19 = " xx.xx-DD -";
      }
      sprintf(s1,"%s %s%s%s (%d;%d)",s1_1,acStack_ea8f + 3,pcVar19 + 10,local_ea7c,
              (ulong)(uint)_local_ea90,(ulong)local_ea80);
      iVar7 = strcmp(s1,*(char **)((long)&testAlphabetParser_parseTests + lVar41));
      if (iVar7 == 0) {
        pcVar19 = "NLD 49.YV\t";
        if (local_ea7c[0] != '\0') {
          pcVar19 = " xx.xx-DD -";
        }
        sprintf((char *)largeUnicodeString1,"%s %s%s%s",s1_1,acStack_ea8f + 3,pcVar19 + 10,
                local_ea7c);
        MVar6 = decodeMapcodeToLatLonUtf8
                          ((double *)largeString2,(double *)u1,pcVar18,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        MVar8 = decodeMapcodeToLatLonUtf8
                          ((double *)s1_2,&lon2,(char *)largeUnicodeString1,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        if (MVar6 != ERR_OK || MVar8 != ERR_OK) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** decoding \"%s\" returns %d, decoding \"%s\" returns %d\n",pcVar18,
                 (ulong)(uint)MVar6,largeUnicodeString1,(ulong)(uint)MVar8);
        }
        if (((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_2[0])) ||
           (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_2[0])))) {
LAB_001cc0b3:
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** decoding \"%s\" returns (%f,%f), decoding \"%s\" returns (%f,%f)\n",
                 largeString2._0_8_,_u1,CONCAT71(uStack_16017,s1_2[0]),lon2,pcVar18,
                 largeUnicodeString1);
        }
        else if ((_u1 != lon2) || (NAN(_u1) || NAN(lon2))) goto LAB_001cc0b3;
        uVar40 = (ulong)(iVar5 + 3);
      }
      else {
        uVar40 = (ulong)(iVar5 + 2);
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myParseMapcodeString(\"%s\") = \"%s\", (expected \"%s\")\n",pcVar18,s1
              );
      }
    }
    else {
      uVar40 = (ulong)(iVar5 + 1);
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** myParseMapcodeString(\"%s\") failed with error %d (expected %s)\n",
             pcVar18,(ulong)(uint)MVar6);
    }
    lVar41 = lVar41 + 0x10;
  } while (lVar41 != 0x98);
  puts("-----------------------------------------------------------\nTerritory name tests");
  iStack_15ffc = testGetFullTerritoryName();
  puts("-----------------------------------------------------------\nTerritory tests");
  __stream = fopen("territories.csv","r");
  uStack_15fe8 = uVar40;
  if (__stream == (FILE *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    uVar40 = 0;
    printf("*** ERROR *** Can\'t read file %s\n","territories.csv");
  }
  else {
    pcVar18 = fgets(s1_1,0x200,__stream);
    uVar3 = 0;
    if ((pcVar18 != (char *)0x0) && (pcVar18 = fgets(s1_1,0x200,__stream), pcVar18 != (char *)0x0))
    {
      uVar3 = 0;
      do {
        pcVar18 = strchr(s1_1,0x2c);
        if (pcVar18 != (char *)0x0) {
          *pcVar18 = '\0';
          iVar5 = atoi(s1_1);
          uVar40 = (ulong)(iVar5 + 0x3e9);
          if (iVar5 < 0) {
            uVar40 = 0xffffffff;
          }
          pcVar18 = pcVar18 + 1;
          pcVar19 = strchr(pcVar18,0x2c);
          TVar4 = (Territory)uVar40;
          if (pcVar19 != (char *)0x0) {
            *pcVar19 = '\0';
            while (*pcVar18 != '\0') {
              pcVar20 = strchr(pcVar18,0x7c);
              if (pcVar20 != (char *)0x0) {
                *pcVar20 = '\0';
              }
              TVar9 = getTerritoryCode(pcVar18,TERRITORY_NONE);
              if (TVar9 != TVar4) {
                pthread_mutex_lock((pthread_mutex_t *)&mutex);
                nrErrors = nrErrors + 1;
                pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                printf("*** ERROR *** Territory string %s returns code %d, expected %d\n",pcVar18,
                       (ulong)(uint)TVar9);
              }
              pcVar18 = pcVar19;
              if (pcVar20 != (char *)0x0) {
                pcVar18 = pcVar20 + 1;
              }
            }
            pcVar18 = pcVar18 + 1;
          }
          pcVar19 = strchr(pcVar18,0x2c);
          if (pcVar19 != (char *)0x0) {
            pTVar17 = getAlphabetsForTerritory(TVar4);
            *pcVar19 = '\0';
            if (*pcVar18 == '\0') {
              lVar41 = 0;
            }
            else {
              lVar41 = 0;
              do {
                pcVar20 = strchr(pcVar18,0x7c);
                if (pcVar20 != (char *)0x0) {
                  *pcVar20 = '\0';
                }
                if ((pTVar17->count <= lVar41) ||
                   (AVar10 = atoi(pcVar18), AVar10 != pTVar17->alphabet[lVar41])) {
                  pthread_mutex_lock((pthread_mutex_t *)&mutex);
                  nrErrors = nrErrors + 1;
                  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                  atoi(pcVar18);
                  printf("*** ERROR *** Mismatch: alphabet %d of territory %d should be %d\n",
                         (ulong)((int)lVar41 + 1),uVar40);
                }
                pcVar18 = pcVar20 + 1;
                if (pcVar20 == (char *)0x0) {
                  pcVar18 = pcVar19;
                }
                lVar41 = lVar41 + 1;
              } while (*pcVar18 != '\0');
            }
            if ((int)lVar41 != pTVar17->count) {
              pthread_mutex_lock((pthread_mutex_t *)&mutex);
              nrErrors = nrErrors + 1;
              pthread_mutex_unlock((pthread_mutex_t *)&mutex);
              printf("*** ERROR *** %d alphabets for territory %d, expected %d\n",
                     (ulong)(uint)pTVar17->count,uVar40);
            }
            pcVar18 = pcVar18 + 1;
          }
          uVar3 = uVar3 + 1;
          pcVar19 = strchr(pcVar18,10);
          if (pcVar19 != (char *)0x0) {
            *pcVar19 = '\0';
            iVar5 = 0;
            do {
              iVar7 = getFullTerritoryNameInLocaleUtf8(s1,TVar4,iVar5,"en_US");
              pcVar19 = strstr(pcVar18,s1);
              if (pcVar19 == (char *)0x0) {
                pthread_mutex_lock((pthread_mutex_t *)&mutex);
                nrErrors = nrErrors + 1;
                pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                printf("*** ERROR *** Name \"%s\" not found in \"%s\"\n",s1,pcVar18);
              }
              iVar5 = iVar5 + 1;
            } while (iVar7 == 0);
          }
        }
        pcVar18 = fgets(s1_1,0x200,__stream);
      } while (pcVar18 != (char *)0x0);
    }
    fclose(__stream);
    uVar40 = (ulong)uVar3;
  }
  printf("%d lines tested from %s\n",uVar40,"territories.csv");
  lVar41 = 0;
  uVar3 = 0;
  do {
    uStack_15ff0 = (ulong)uVar3;
    pcVar18 = TEST_TERRITORIES[lVar41].codeISO;
    TVar4 = TEST_TERRITORIES[lVar41].territory;
    iStack_15ff4 = TEST_TERRITORIES[lVar41].isAlias;
    iVar5 = TEST_TERRITORIES[lVar41].needsParent;
    TVar9 = TEST_TERRITORIES[lVar41].parent;
    uVar3 = 1;
    uVar40 = 0;
    lStack_15fe0 = lVar41;
    iVar7 = 0;
    do {
      iVar13 = iVar7;
      strcpy(s1,pcVar18);
      if (uVar3 == 1 && iVar5 == 0) {
        TVar11 = getTerritoryCode(s1,TERRITORY_NONE);
        iVar13 = iVar13 + 1;
        if (TVar11 != TVar4) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          pcVar19 = getTerritoryIsoName(s1_1,TVar4,0);
          printf("*** ERROR *** getTerritoryCode(\'%s\')=%d but expected %d (%s)\n",s1,
                 (ulong)(uint)TVar11,TVar4,pcVar19);
        }
      }
      pp_Var21 = __ctype_tolower_loc();
      s1[uVar40] = (char)(*pp_Var21)[s1[uVar40]];
      TVar11 = getTerritoryCode(s1,TVar9);
      if (TVar11 != TVar4) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar19 = "";
        if (TVar9 != TERRITORY_UNKNOWN) {
          pcVar19 = getTerritoryIsoName(s1_1,TVar9,0);
        }
        printf("*** ERROR *** getTerritoryCode(\'%s\',%s)=%d but expected %d\n",s1,pcVar19,
               (ulong)(uint)TVar11,TVar4);
      }
      iVar7 = iVar13 + 1;
      uVar40 = (ulong)uVar3;
      sVar16 = strlen(pcVar18);
      uVar3 = uVar3 + 1;
    } while (uVar40 <= sVar16);
    if (iStack_15ff4 == 0 && _TERRITORY_MIN < TVar9) {
      getTerritoryIsoName(s1_1,TVar4,0);
      iVar7 = iVar13 + 2;
      iVar5 = strcmp(s1_1,pcVar18);
      if ((iVar5 != 0) && (iVar5 = strcmp(acStack_ea97 + 2,pcVar18), iVar5 != 0)) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** getTerritoryIsoName(%d)=\"%s\" which does not equal or contain \"%s\"\n"
               ,TVar4,s1_1,pcVar18);
      }
    }
    uVar3 = (int)uStack_15ff0 + iVar7;
    lVar41 = lStack_15fe0 + 1;
  } while (lVar41 != 0x3c4);
  pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_NONE,0);
  if ((((*pcVar18 != '\0') ||
       (pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_UNKNOWN,0), *pcVar18 != '\0')) ||
      (pcVar18 = getTerritoryIsoName(s1_1,_TERRITORY_MIN,0), *pcVar18 != '\0')) ||
     (pcVar18 = getTerritoryIsoName(s1_1,_TERRITORY_MAX,0), *pcVar18 != '\0')) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    puts("*** ERROR *** getTerritoryIsoName returned nonempty for bad arguments");
  }
  TVar4 = getTerritoryCode((char *)0x0,TERRITORY_VAT);
  if (TVar4 != TERRITORY_NONE) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    puts("*** ERROR *** unexpected getTerritoryCode return for bad arguments");
  }
  pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_US_CA,1);
  if ((((*pcVar18 == 'C') && (pcVar18[1] == 'A')) &&
      ((pcVar18[2] == '\0' &&
       ((pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_IN_DD,1), *pcVar18 == 'D' &&
        (pcVar18[1] == 'D')))))) && (pcVar18[2] == '\0')) {
    pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_NLD,1);
    iVar5 = strcmp(pcVar18,"NLD");
    if (iVar5 == 0) {
      pcVar18 = getTerritoryIsoName(s1_1,TERRITORY_USA,1);
      iVar5 = strcmp(pcVar18,"USA");
      if (iVar5 == 0) goto LAB_001cc8c9;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  nrErrors = nrErrors + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  puts("*** ERROR *** getTerritoryIsoName returned bad short versions");
LAB_001cc8c9:
  lVar41 = 0;
  do {
    TVar4 = (&testTerritoryCode_ptcTestData)[lVar41 * 2];
    TVar9 = getParentCountryOf(TVar4);
    if (TVar9 != (&DAT_001d3224)[lVar41 * 2]) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** getParentCountryOf(%d) returned unexpected %d\n",(ulong)(uint)TVar4,
             (ulong)(uint)TVar9);
    }
    lVar41 = lVar41 + 1;
  } while (lVar41 != 0x10);
  pcVar18 = "AL";
  lVar41 = 0;
  do {
    TVar4 = *(Territory *)((long)&testTerritoryCode_tcTestData + lVar41);
    TVar9 = *(Territory *)((long)&DAT_002e0394 + lVar41);
    TVar11 = getTerritoryCode(pcVar18,TVar9);
    if (TVar11 != TVar4) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** getTerritoryCode(\"%s\", %d)=%d, expected %d\n",pcVar18,
             (ulong)(uint)TVar9,(ulong)(uint)TVar11,(ulong)(uint)TVar4);
    }
    pcVar18 = *(char **)((long)&DAT_002e03a8 + lVar41);
    lVar41 = lVar41 + 0x10;
  } while (lVar41 != 0x170);
  lVar41 = 0x18;
  do {
    pcVar18 = *(char **)(&UNK_002e04f8 + lVar41);
    TVar4 = getTerritoryCode(pcVar18,TERRITORY_NONE);
    dVar45 = *(double *)(&UNK_002e0500 + lVar41);
    uVar27 = multipleBordersNearby(dVar45,*(double *)(&UNK_002e0508 + lVar41),TVar4);
    uVar3 = *(uint *)((long)&DAT_002e0510 + lVar41);
    if (uVar27 != uVar3) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** multipleBordersNearby(%+18.13f,%+18.13f, \"%s\") not %d\n",dVar45,
             pcVar18,(ulong)uVar3);
    }
    lVar41 = lVar41 + 0x20;
  } while (lVar41 != 0x3f8);
  puts("-----------------------------------------------------------\nDistance tests");
  dVar45 = maxErrorInMeters(99);
  if ((dVar45 != 0.0) || (NAN(dVar45))) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    maxErrorInMeters(99);
    printf("*** ERROR *** maxErrorInMeters(99) = %f (expected 0.0)\n");
  }
  dVar45 = distanceInMeters(0.0,0.0,0.0,1.5);
  testDistance(166979.23618950002,dVar45);
  dVar45 = distanceInMeters(0.0,0.0,0.0,2.0);
  testDistance(222638.981586,dVar45);
  dVar45 = distanceInMeters(0.0,0.0,0.0,2.5);
  testDistance(278298.7269825,dVar45);
  dVar45 = distanceInMeters(0.0,-1.0,0.0,0.5);
  testDistance(166979.23618950002,dVar45);
  dVar45 = distanceInMeters(0.0,-1.0,0.0,1.0);
  testDistance(222638.981586,dVar45);
  dVar45 = distanceInMeters(0.0,-1.0,0.0,1.5);
  testDistance(278298.7269825,dVar45);
  dVar45 = distanceInMeters(0.0,0.5,0.0,-1.0);
  testDistance(166979.23618950002,dVar45);
  dVar45 = distanceInMeters(0.0,1.0,0.0,-1.0);
  testDistance(222638.981586,dVar45);
  dVar45 = distanceInMeters(0.0,1.5,0.0,-1.0);
  testDistance(278298.7269825,dVar45);
  dVar45 = distanceInMeters(0.0,359.0,0.0,0.5);
  testDistance(166979.23618950002,dVar45);
  dVar45 = distanceInMeters(0.0,359.0,0.0,1.0);
  testDistance(222638.981586,dVar45);
  dVar45 = distanceInMeters(0.0,359.0,0.0,1.5);
  testDistance(278298.7269825,dVar45);
  dVar45 = distanceInMeters(0.0,0.5,0.0,359.0);
  testDistance(166979.23618950002,dVar45);
  dVar45 = distanceInMeters(0.0,1.0,0.0,359.0);
  testDistance(222638.981586,dVar45);
  dVar45 = distanceInMeters(0.0,1.5,0.0,359.0);
  testDistance(278298.7269825,dVar45);
  dVar45 = distanceInMeters(0.5,0.0,-0.5,0.0);
  testDistance(110946.252133,dVar45);
  dVar45 = distanceInMeters(1.0,0.0,-0.0,0.0);
  testDistance(110946.252133,dVar45);
  dVar45 = distanceInMeters(0.0,0.0,-1.0,0.0);
  testDistance(110946.252133,dVar45);
  uVar40 = uStack_15fe8;
  iVar5 = iStack_15ff8;
  uVar28 = 0;
  do {
    dVar45 = distanceInMeters((double)(&testDistances_coordpairs)[uVar28],
                              (double)(&DAT_001d32a8)[uVar28],(double)(&DAT_001d32b0)[uVar28],
                              (double)(&DAT_001d32b8)[uVar28]);
    dVar46 = floor(dVar45 * 100000.0 + 0.5);
    if ((dVar46 != (double)(&DAT_001d32c0)[uVar28]) ||
       (NAN(dVar46) || NAN((double)(&DAT_001d32c0)[uVar28]))) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** distanceInMeters %d failed: %f\n",dVar45,uVar28 & 0xffffffff);
    }
    uVar28 = uVar28 + 5;
  } while ((int)uVar28 != 0x4b);
  puts("-----------------------------------------------------------\nMapcode format tests");
  uStack_16028 = (int)uStack_15ff0 + (int)uVar40 + iVar7 + iStack_15ffc + iVar5 + 0x13de;
  pcVar18 = "nld bc.xy-x1y";
  plVar30 = (long *)(testMapcodeFormats_formattests + 0x10);
  uVar29 = 0;
  uVar3 = 0;
  uVar27 = 0;
  do {
    MVar6 = decodeMapcodeToLatLonUtf8
                      ((double *)s1,(double *)largeUnicodeString1,pcVar18,TERRITORY_UNKNOWN,
                       (MapcodeElements *)s1_1);
    if ((uint)(MVar6 + ~ERR_BAD_MAPCODE_LENGTH) < 3) {
      MVar6 = ERR_OK;
    }
    MVar12 = compareWithMapcodeFormatUtf8(pcVar18);
    MVar8 = *(MapcodeError *)(plVar30 + -1);
    uVar3 = uVar3 + (MVar8 == ERR_OK);
    if ((MVar6 != MVar12) && (MVar8 != ERR_UNKNOWN_TERRITORY || MVar12 != ERR_OK)) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** \"%s\" : myParseMapcodeString=%d, compareWithMapcodeFormatUtf8=%d\n",
             pcVar18,(ulong)(uint)MVar6);
    }
    if (MVar8 != MVar6) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** compareWithMapcodeFormatUtf8(\"%s\") returns %d (%d expected)\n",pcVar18
             ,(ulong)(uint)MVar6);
    }
    if (MVar6 == ERR_OK) {
      MVar6 = decodeMapcodeToLatLonUtf8
                        ((double *)s1,(double *)largeUnicodeString1,pcVar18,TERRITORY_UNKNOWN,
                         (MapcodeElements *)0x0);
      if (MVar6 != *(MapcodeError *)((long)plVar30 + -4)) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myParseMapcodeString(\"%s\")=%d, expected %d\n",pcVar18,
               (ulong)(uint)MVar6);
      }
      uVar27 = uVar27 + 1;
    }
    pcVar18 = (char *)*plVar30;
    uVar29 = uVar29 + 1;
    plVar30 = plVar30 + 2;
    uStack_16028 = uStack_16028 + 3;
  } while (pcVar18 != (char *)0x0);
  if (uVar27 != uVar3) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    printf("*** ERROR *** %d of %d myParseMapcodeString() calls succeeded (expected %d)\n",
           (ulong)uVar27,(ulong)uVar29);
  }
  lVar41 = 0;
  do {
    pcVar18 = *(char **)((long)&testFailingDecodes_badcodes + lVar41);
    MVar6 = decodeMapcodeToLatLonUtf8
                      ((double *)s1_1,(double *)s1,pcVar18,TERRITORY_UNKNOWN,(MapcodeElements *)0x0)
    ;
    if (~ERR_OK < MVar6) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** invalid mapcode \"%s\" decodes without error\n",pcVar18);
    }
    lVar41 = lVar41 + 8;
  } while (lVar41 != 0x1b8);
  puts("-----------------------------------------------------------\nEncode/decode tests");
  pcVar18 = "NLD GG.LCG-RJQ4";
  lVar41 = 0;
  do {
    encodeLatLonToSingleMapcode
              (s1_1,*(double *)((long)&DAT_002e1d00 + lVar41),
               *(double *)((long)&DAT_002e1d08 + lVar41),
               *(Territory *)((long)&DAT_002e1d10 + lVar41),4);
    iVar5 = strcmp(s1_1,pcVar18);
    if (iVar5 != 0) {
      printf("*** ERROR *** encodeLatLonToSingleMapcode()=%s, expected %s\n",s1_1,pcVar18);
    }
    pcVar18 = *(char **)((long)&PTR_anon_var_dwarf_6254_002e1d38 + lVar41);
    lVar41 = lVar41 + 0x20;
  } while (lVar41 != 0x60);
  uVar3 = 0;
  do {
    uVar27 = encodeLatLonToSelectedMapcode(s1_1,52.158993,4.492346,TERRITORY_NONE,0,uVar3);
    if (uVar27 != 4) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)uVar27);
    }
    switch(uVar3) {
    case 0:
      if (CONCAT35(_local_ea90,CONCAT32(acStack_ea97._4_3_,acStack_ea97._2_2_)) != 0x47302e4d4a5120
          || CONCAT35(acStack_ea97._4_3_,
                      CONCAT23(acStack_ea97._2_2_,CONCAT21(acStack_ea97._0_2_,s1_1[0]))) !=
             0x2e4d4a5120444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar18 = "NLD QJM.0G";
        uVar26 = 0;
LAB_001cd2e2:
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,pcVar18,s1_1,uVar26);
      }
      break;
    case 1:
      if (_local_ea90 != 0x433531 ||
          CONCAT35(acStack_ea97._4_3_,
                   CONCAT23(acStack_ea97._2_2_,CONCAT21(acStack_ea97._0_2_,s1_1[0]))) !=
          0x2e515a4320444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar18 = "NLD CZQ.15C";
        uVar26 = 1;
        goto LAB_001cd2e2;
      }
      break;
    case 2:
      if (CONCAT17(acStack_ea8f[3],CONCAT43(_local_ea90,acStack_ea97._4_3_)) != 0x4e5a4d2e4a3933 ||
          CONCAT35(acStack_ea97._4_3_,
                   CONCAT23(acStack_ea97._2_2_,CONCAT21(acStack_ea97._0_2_,s1_1[0]))) !=
          0x4a39334e20444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar18 = "NLD N39J.MZN";
        uVar26 = 2;
        goto LAB_001cd2e2;
      }
      break;
    case 3:
      if (CONCAT35(_local_ea90,CONCAT32(acStack_ea97._4_3_,acStack_ea97._2_2_)) != 0x53395a542e344e
          || CONCAT35(acStack_ea97._4_3_,
                      CONCAT23(acStack_ea97._2_2_,CONCAT21(acStack_ea97._0_2_,s1_1[0]))) !=
             0x5a542e344e564856) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar18 = "VHVN4.TZ9S";
        uVar26 = 3;
        goto LAB_001cd2e2;
      }
      break;
    default:
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)uVar3);
    }
    uVar3 = uVar3 + 1;
    if ((int)uVar27 <= (int)uVar3) {
      lVar41 = 0;
      printf("%d encodes\n",0x3dee);
      ppcVar38 = &ENCODE_TEST[0].mapcode;
      iVar5 = 0;
      do {
        iVar7 = iVar5;
        showTestProgress((int)lVar41,0x3dee,iVar7);
        iVar13 = testEncodeAndDecode(*ppcVar38,((EncodeTestRecord *)(ppcVar38 + -3))->latitude,
                                     (double)ppcVar38[-2],*(int *)(ppcVar38 + -1),
                                     *(int *)((long)ppcVar38 + -4));
        lVar41 = lVar41 + 1;
        ppcVar38 = ppcVar38 + 4;
        iVar5 = iVar13 + iVar7;
      } while (lVar41 != 0x3dee);
      puts("-----------------------------------------------------------\nRe-encode tests");
      printf("%d records\n",0x3fe4);
      lVar41 = 0x3e9;
      nrTests = 0;
      iVar5 = 0;
      do {
        at = *(int *)(lVar41 * 4 + 0x1d2560);
        showTestProgress(at,0x3fe4,nrTests);
        iVar37 = at - iVar5;
        if (iVar37 == 0 || at < iVar5) {
          iVar5 = 0;
        }
        else {
          pTVar43 = TERRITORY_BOUNDARIES + iVar5;
          iVar5 = 0;
          do {
            lVar22 = (long)iVar5 * 0x10;
            pcVar18 = s1_1 + lVar22;
            pcVar18[0] = '\0';
            pcVar18[1] = '\0';
            pcVar18[2] = '\0';
            pcVar18[3] = '\0';
            *(TerritoryBoundary **)(acStack_ea8f + lVar22 + -1) = pTVar43;
            iVar14 = pthread_create((pthread_t *)(s1 + (long)iVar5 * 8),(pthread_attr_t *)0x0,
                                    executeTestAround,pcVar18);
            if (iVar14 != 0) {
              pthread_mutex_lock((pthread_mutex_t *)&mutex);
              nrErrors = nrErrors + 1;
              pthread_mutex_unlock((pthread_mutex_t *)&mutex);
              puts("*** ERROR *** Cannot create thread");
              nrTests = 0;
              goto LAB_001cd4bb;
            }
            iVar14 = iVar5 + 1;
            bVar44 = 0xe < iVar5;
            iVar5 = iVar14;
            if (bVar44) {
              iVar5 = joinThreads((pthread_t *)s1,(ContextTestAround *)s1_1,iVar14);
              nrTests = nrTests + iVar5;
              iVar5 = 0;
            }
            pTVar43 = pTVar43 + 1;
            iVar37 = iVar37 + -1;
          } while (iVar37 != 0);
        }
        iVar5 = joinThreads((pthread_t *)s1,(ContextTestAround *)s1_1,iVar5);
        nrTests = nrTests + iVar5;
        lVar41 = lVar41 + 1;
        iVar5 = at;
      } while (lVar41 != 0x5fe);
LAB_001cd4bb:
      puts("-----------------------------------------------------------");
      printf("Done.\nExecuted %d tests, found %d errors\n",
             (ulong)(iVar13 + iVar7 + uStack_16028 + nrTests),(ulong)(uint)nrErrors);
      pcVar18 = "Unit tests passed";
      if (0 < nrErrors) {
        pcVar18 = "UNIT TESTS FAILED!";
      }
      puts(pcVar18);
      return nrErrors;
    }
  } while( true );
}

Assistant:

int main(const int argc, const char **argv) {
    int nrTests = 0;

    // Ref unused var.
    REF(ISO3166_ALPHA[0]);

    printf("Mapcode C Library Unit Tests\n");
    printf("Library version %s (data version %s)\n", MAPCODE_C_VERSION, MAPCODE_DATA_VERSION);
#ifdef NO_POSIX_THREADS
    printf("Compiler options: NO_POSIX_THREADS\n");
#else
    printf("Using up to %d threads to test in parallel...\n", MAX_THREADS);
#endif

    if (argc != 1 || argv == NULL) {
        printf("*** ERROR *** unittest takes no arguments!\n");
        exit(1);
    }

    printf("-----------------------------------------------------------\nEnvironment tests\n");
    nrTests += testEnvironment();

    printf("-----------------------------------------------------------\nRobustness tests\n");
    nrTests += testRobustness();

    printf("-----------------------------------------------------------\nAlphabet tests\n");
    nrTests += testAlphabetRobustness();
    nrTests += testAlphabets();

    printf("-----------------------------------------------------------\nAlphabet per territory tests\n");
    nrTests += testAlphabetPerTerritory();

    printf("-----------------------------------------------------------\nParser tests\n");
    nrTests += testAlphabetParser();

    printf("-----------------------------------------------------------\nTerritory name tests\n");
    nrTests += testGetFullTerritoryName();

    printf("-----------------------------------------------------------\nTerritory tests\n");
    nrTests += testTerritoriesCsv();
    nrTests += testTerritories();
    nrTests += testTerritoryCode();
    nrTests += testTerritoryInsides();

    printf("-----------------------------------------------------------\nDistance tests\n");
    nrTests += testDistances();

    printf("-----------------------------------------------------------\nMapcode format tests\n");
    nrTests += testMapcodeFormats();
    nrTests += testFailingDecodes();

    printf("-----------------------------------------------------------\nEncode/decode tests\n");
    nrTests += testSingleEncodes();
    nrTests += testSelectedEncodes();
    nrTests += testEncodeDecode();

    printf("-----------------------------------------------------------\nRe-encode tests\n");
    nrTests += testReEncode();

    printf("-----------------------------------------------------------\n");
    printf("Done.\nExecuted %d tests, found %d errors\n", nrTests, nrErrors);
    if (nrErrors > 0) {
        printf("UNIT TESTS FAILED!\n");
    } else {
        printf("Unit tests passed\n");
    }
    return nrErrors;
}